

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t spvtools::val::MemoryPass(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  spv_result_t sVar2;
  spv_result_t error_16;
  spv_result_t error_15;
  spv_result_t error_14;
  spv_result_t error_13;
  spv_result_t error_12;
  spv_result_t error_11;
  spv_result_t error_10;
  spv_result_t error_9;
  spv_result_t error_8;
  spv_result_t error_7;
  spv_result_t error_6;
  spv_result_t error_5;
  spv_result_t error_4;
  spv_result_t error_3;
  spv_result_t error_2;
  spv_result_t error_1;
  spv_result_t error;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  OVar1 = Instruction::opcode((Instruction *)inst);
  if (OVar1 == OpVariable) {
LAB_00b49cf5:
    sVar2 = anon_unknown_2::ValidateVariable(_,inst);
    goto joined_r0x00b49e85;
  }
  if (OVar1 == OpImageTexelPointer) {
    return SPV_SUCCESS;
  }
  if (OVar1 == OpLoad) {
    sVar2 = anon_unknown_2::ValidateLoad(_,inst);
    goto joined_r0x00b49e85;
  }
  if (OVar1 == OpStore) {
    sVar2 = anon_unknown_2::ValidateStore(_,inst);
    goto joined_r0x00b49e85;
  }
  if (OVar1 - OpCopyMemory < 2) {
    sVar2 = anon_unknown_2::ValidateCopyMemory(_,inst);
    goto joined_r0x00b49e85;
  }
  if (1 < OVar1 - OpAccessChain) {
    if (OVar1 == OpPtrAccessChain) {
LAB_00b49d8d:
      sVar2 = anon_unknown_2::ValidatePtrAccessChain(_,inst);
      goto joined_r0x00b49e85;
    }
    if (OVar1 == OpArrayLength) {
LAB_00b49dff:
      sVar2 = anon_unknown_2::ValidateArrayLength(_,inst);
      goto joined_r0x00b49e85;
    }
    if (OVar1 == OpGenericPtrMemSemantics) {
      return SPV_SUCCESS;
    }
    if (OVar1 != OpInBoundsPtrAccessChain) {
      if (OVar1 - OpPtrEqual < 3) {
        sVar2 = anon_unknown_2::ValidatePtrComparison(_,inst);
        goto joined_r0x00b49e85;
      }
      if (OVar1 == OpUntypedVariableKHR) goto LAB_00b49cf5;
      if (1 < OVar1 - OpUntypedAccessChainKHR) {
        if (OVar1 - OpUntypedPtrAccessChainKHR < 2) goto LAB_00b49d8d;
        if (OVar1 == OpUntypedArrayLengthKHR) goto LAB_00b49dff;
        if (OVar1 - OpCooperativeMatrixLoadKHR < 2) {
          sVar2 = anon_unknown_2::ValidateCooperativeMatrixLoadStoreKHR(_,inst);
          goto joined_r0x00b49e85;
        }
        if (OVar1 == OpCooperativeMatrixLengthKHR) {
LAB_00b49e4b:
          sVar2 = anon_unknown_2::ValidateCooperativeMatrixLengthNV(_,inst);
        }
        else {
          if (OVar1 != OpCooperativeVectorMatrixMulNV) {
            if (OVar1 == OpCooperativeVectorOuterProductAccumulateNV) {
              sVar2 = anon_unknown_2::ValidateCooperativeVectorOuterProductNV(_,inst);
              goto joined_r0x00b49e85;
            }
            if (OVar1 == OpCooperativeVectorReduceSumAccumulateNV) {
              sVar2 = anon_unknown_2::ValidateCooperativeVectorReduceSumNV(_,inst);
              goto joined_r0x00b49e85;
            }
            if (OVar1 != OpCooperativeVectorMatrixMulAddNV) {
              if (OVar1 - OpCooperativeVectorLoadNV < 2) {
                sVar2 = anon_unknown_2::ValidateCooperativeVectorLoadStoreNV(_,inst);
                goto joined_r0x00b49e85;
              }
              if (OVar1 - OpCooperativeMatrixLoadNV < 2) {
                sVar2 = anon_unknown_2::ValidateCooperativeMatrixLoadStoreNV(_,inst);
                goto joined_r0x00b49e85;
              }
              if (OVar1 != OpCooperativeMatrixLengthNV) {
                if (OVar1 - OpCooperativeMatrixLoadTensorNV < 2) {
                  sVar2 = anon_unknown_2::ValidateCooperativeMatrixLoadStoreTensorNV(_,inst);
                }
                else {
                  if (OVar1 != OpRawAccessChainNV) {
                    return SPV_SUCCESS;
                  }
                  sVar2 = anon_unknown_2::ValidateRawAccessChain(_,inst);
                }
                goto joined_r0x00b49e85;
              }
              goto LAB_00b49e4b;
            }
          }
          sVar2 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV(_,inst);
        }
        goto joined_r0x00b49e85;
      }
    }
  }
  sVar2 = anon_unknown_2::ValidateAccessChain(_,inst);
joined_r0x00b49e85:
  if (sVar2 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar2;
}

Assistant:

spv_result_t MemoryPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
      if (auto error = ValidateVariable(_, inst)) return error;
      break;
    case spv::Op::OpLoad:
      if (auto error = ValidateLoad(_, inst)) return error;
      break;
    case spv::Op::OpStore:
      if (auto error = ValidateStore(_, inst)) return error;
      break;
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
      if (auto error = ValidateCopyMemory(_, inst)) return error;
      break;
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpUntypedPtrAccessChainKHR:
    case spv::Op::OpUntypedInBoundsPtrAccessChainKHR:
      if (auto error = ValidatePtrAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
      if (auto error = ValidateAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpRawAccessChainNV:
      if (auto error = ValidateRawAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpArrayLength:
    case spv::Op::OpUntypedArrayLengthKHR:
      if (auto error = ValidateArrayLength(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadNV:
    case spv::Op::OpCooperativeMatrixStoreNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLengthKHR:
    case spv::Op::OpCooperativeMatrixLengthNV:
      if (auto error = ValidateCooperativeMatrixLengthNV(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadKHR:
    case spv::Op::OpCooperativeMatrixStoreKHR:
      if (auto error = ValidateCooperativeMatrixLoadStoreKHR(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadTensorNV:
    case spv::Op::OpCooperativeMatrixStoreTensorNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreTensorNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorLoadNV:
    case spv::Op::OpCooperativeVectorStoreNV:
      if (auto error = ValidateCooperativeVectorLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorOuterProductAccumulateNV:
      if (auto error = ValidateCooperativeVectorOuterProductNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorReduceSumAccumulateNV:
      if (auto error = ValidateCooperativeVectorReduceSumNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorMatrixMulNV:
    case spv::Op::OpCooperativeVectorMatrixMulAddNV:
      if (auto error = ValidateCooperativeVectorMatrixMulNV(_, inst))
        return error;
      break;
    case spv::Op::OpPtrEqual:
    case spv::Op::OpPtrNotEqual:
    case spv::Op::OpPtrDiff:
      if (auto error = ValidatePtrComparison(_, inst)) return error;
      break;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpGenericPtrMemSemantics:
    default:
      break;
  }

  return SPV_SUCCESS;
}